

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

void __thiscall BGIPSolution::Load(BGIPSolution *this,string *filename)

{
  E *this_00;
  
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"BGIPSolution::Load not yet implemented");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void BGIPSolution::Load(const string& filename)
{
    throw(E("BGIPSolution::Load not yet implemented"));
#if 0
    ifstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "BGIPSolution::Load: failed to "
           << "open file " << filename << endl;
        throw E(ss);
    }

    LIndex index;
    double payoff;

    string buffer;
    getline(fp,buffer);
    istringstream is(buffer);
    is >> index;
    is >> payoff;

    SetPolicy(index);
    SetPayoff(payoff);
#endif
}